

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPubkey *ext_pubkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  void *pvVar1;
  uint32_t uVar2;
  uint8_t uVar3;
  undefined3 uVar4;
  uint32_t uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ExtPrivkey *local_48;
  Privkey *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  local_40 = &this->privkey_;
  local_38 = child_num_list;
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  local_48 = &this->extprivkey_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ext_pubkey);
  uVar2 = ext_pubkey->fingerprint_;
  uVar3 = ext_pubkey->depth_;
  uVar4 = *(undefined3 *)&ext_pubkey->field_0x21;
  uVar5 = ext_pubkey->child_num_;
  (this->extpubkey_).version_ = ext_pubkey->version_;
  (this->extpubkey_).fingerprint_ = uVar2;
  (this->extpubkey_).depth_ = uVar3;
  *(undefined3 *)&(this->extpubkey_).field_0x21 = uVar4;
  (this->extpubkey_).child_num_ = uVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).chaincode_.data_,&(ext_pubkey->chaincode_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ext_pubkey->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).tweak_sum_.data_,&(ext_pubkey->tweak_sum_).data_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->fingerprint_).data_,&finterprint->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ext_pubkey->pubkey_
            );
  pvVar1 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPubkey& ext_pubkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : extpubkey_(ext_pubkey),
      path_(child_num_list),
      fingerprint_(finterprint) {
  pubkey_ = ext_pubkey.GetPubkey();
}